

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O3

bool __thiscall EOPlus::Context::TriggerRule(Context *this,string *rule)

{
  pointer pcVar1;
  bool bVar2;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  string local_40;
  
  pcVar1 = (rule->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + rule->_M_string_length);
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_50 = std::
             _Function_handler<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/GabrielLins64[P]custom-eoserv/tu/../src/eoplus/context.cpp:165:34)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/GabrielLins64[P]custom-eoserv/tu/../src/eoplus/context.cpp:165:34)>
             ::_M_manager;
  bVar2 = TriggerRule(this,&local_40,
                      (function<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&)>
                       *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool Context::TriggerRule(std::string rule)
	{
		return this->TriggerRule(rule, [](const std::deque<util::variant>&) { return true; });
	}